

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O0

void jsons_print_module(lyout *out,lys_module *module)

{
  char *val;
  lys_module *module_local;
  lyout *out_local;
  
  ly_print(out,"{\"%s\":{",module->name);
  ly_print(out,"\"namespace\":\"%s\"",module->ns);
  ly_print(out,",\"prefix\":\"%s\"",module->prefix);
  jsons_print_text(out,"description","text",module->dsc,1,(int *)0x0);
  jsons_print_text(out,"reference","text",module->ref,1,(int *)0x0);
  jsons_print_text(out,"organization","text",module->org,1,(int *)0x0);
  jsons_print_text(out,"contact","text",module->contact,1,(int *)0x0);
  val = "1.0";
  if (((byte)(*(ushort *)&module->field_0x40 >> 1) & 7) == 2) {
    val = "1.1";
  }
  jsons_print_object(out,"yang-version","value",val,1,(int *)0x0);
  jsons_print_revisions(out,module->rev,module->rev_size,(int *)0x0);
  jsons_print_includes(out,module->inc,module->inc_size,(int *)0x0);
  jsons_print_imports(out,module,(int *)0x0);
  jsons_print_typedefs(out,module->tpdf,(uint8_t)module->tpdf_size,(int *)0x0);
  jsons_print_identities(out,module->ident,module->ident_size,(int *)0x0);
  jsons_print_features(out,module->features,module->features_size,(int *)0x0);
  jsons_print_augment(out,module->augment,module->augment_size,(int *)0x0);
  jsons_print_deviation(out,module->deviation,module->deviation_size,(int *)0x0);
  jsons_print_groupings(out,module->data,(int *)0x0);
  jsons_print_data(out,module,module->data,(int *)0x0);
  jsons_print_rpcs(out,module->data,(int *)0x0);
  jsons_print_notifs(out,module->data,(int *)0x0);
  ly_print(out,"}}");
  return;
}

Assistant:

static void
jsons_print_module(struct lyout *out, const struct lys_module *module)
{
    ly_print(out, "{\"%s\":{", module->name);
    ly_print(out, "\"namespace\":\"%s\"", module->ns);
    ly_print(out, ",\"prefix\":\"%s\"", module->prefix);
    jsons_print_text(out, "description", "text", module->dsc, 1, NULL);
    jsons_print_text(out, "reference", "text", module->ref, 1, NULL);
    jsons_print_text(out, "organization", "text", module->org, 1, NULL);
    jsons_print_text(out, "contact", "text", module->contact, 1, NULL);
    jsons_print_object(out, "yang-version", "value", (module->version == LYS_VERSION_1_1) ? "1.1" : "1.0", 1, NULL);
    /* TODO deviated-by */

    jsons_print_revisions(out, module->rev, module->rev_size, NULL);
    jsons_print_includes(out, module->inc, module->inc_size, NULL);
    jsons_print_imports(out, module, NULL);
    jsons_print_typedefs(out, module->tpdf, module->tpdf_size, NULL);
    jsons_print_identities(out, module->ident, module->ident_size, NULL);
    jsons_print_features(out, module->features, module->features_size, NULL);
    jsons_print_augment(out, module->augment, module->augment_size, NULL);
    jsons_print_deviation(out, module->deviation, module->deviation_size, NULL);

    jsons_print_groupings(out, module->data, NULL);
    jsons_print_data(out, module, module->data, NULL);
    jsons_print_rpcs(out, module->data, NULL);
    jsons_print_notifs(out, module->data, NULL);

    /* close the module */
    ly_print(out, "}}");
}